

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_KillTracer(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar3;
  AActor *pAVar4;
  char *pcVar5;
  int iVar6;
  int selector;
  int selector_00;
  int local_48;
  int local_44;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_005c8b64;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar4 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar4 == (AActor *)0x0) {
LAB_005c8858:
        pAVar4 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c8b64;
        }
      }
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_005c8b54;
          this = (DObject *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (this != (DObject *)0x0) {
              bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
              if (!bVar2) {
                pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_005c8b64;
              }
            }
          }
          else if (this != (DObject *)0x0) goto LAB_005c8b54;
        }
        if (2 < (uint)numparam) {
          VVar1 = param[2].field_0.field_3.Type;
          if ((VVar1 != 0xff) &&
             ((VVar1 != '\x03' ||
              ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))
             )) {
            pcVar5 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
            ;
            goto LAB_005c8b64;
          }
          if (numparam == 3) goto LAB_005c88e5;
          VVar1 = param[3].field_0.field_3.Type;
          if (VVar1 == '\0') {
            local_48 = param[3].field_0.i;
          }
          else {
            local_48 = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x193a,
                            "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
          if ((uint)numparam < 5) {
            local_40 = (PClassActor *)0x0;
            local_44 = 0;
LAB_005c8ab5:
            iVar6 = 0;
LAB_005c8ab8:
            selector = 0;
          }
          else {
            VVar1 = param[4].field_0.field_3.Type;
            if (VVar1 == '\0') {
              local_44 = param[4].field_0.i;
            }
            else {
              local_44 = 0;
              if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x193b,
                              "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
            if (numparam == 5) {
              local_40 = (PClassActor *)0x0;
              goto LAB_005c8ab5;
            }
            VVar1 = param[5].field_0.field_3.Type;
            if (VVar1 == 0xff) goto LAB_005c8a76;
            if (VVar1 != '\x03') {
LAB_005c8b85:
              pcVar5 = 
              "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
              ;
LAB_005c8b8c:
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x193c,
                            "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
            local_40 = (PClassActor *)param[5].field_0.field_1.a;
            if (param[5].field_0.field_1.atag == 1) {
              if (local_40 == (PClassActor *)0x0) goto LAB_005c8a76;
              bVar2 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)local_40);
              if (!bVar2) {
                pcVar5 = "filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))";
                goto LAB_005c8b8c;
              }
            }
            else {
              if (local_40 != (PClassActor *)0x0) goto LAB_005c8b85;
LAB_005c8a76:
              local_40 = (PClassActor *)0x0;
            }
            if ((uint)numparam < 7) goto LAB_005c8ab5;
            VVar1 = param[6].field_0.field_3.Type;
            if (VVar1 == '\0') {
              iVar6 = param[6].field_0.i;
            }
            else {
              iVar6 = 0;
              if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x193d,
                              "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
            if (numparam == 7) goto LAB_005c8ab8;
            VVar1 = param[7].field_0.field_3.Type;
            if (VVar1 == '\0') {
              selector = param[7].field_0.i;
            }
            else {
              selector = 0;
              if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x193e,
                              "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
            selector_00 = 0;
            if (8 < (uint)numparam) {
              VVar1 = param[8].field_0.field_3.Type;
              if (VVar1 == '\0') {
                selector_00 = param[8].field_0.i;
              }
              else if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x193f,
                              "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
              goto LAB_005c8901;
            }
          }
          selector_00 = 0;
          goto LAB_005c8901;
        }
      }
LAB_005c88e5:
      selector = 0;
      local_40 = (PClassActor *)0x0;
      local_48 = 0;
      local_44 = 0;
      iVar6 = 0;
      selector_00 = 0;
LAB_005c8901:
      source = COPY_AAPTR(pAVar4,selector);
      inflictor = COPY_AAPTR(pAVar4,selector_00);
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pAVar4->tracer);
      if (pAVar3 != (AActor *)0x0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)&pAVar4->tracer);
        local_38.Index = iVar6;
        local_34.Index = local_48;
        DoKill(pAVar4,inflictor,source,&local_34,local_44,local_40,&local_38);
      }
      return 0;
    }
    if (pAVar4 == (AActor *)0x0) goto LAB_005c8858;
  }
LAB_005c8b54:
  pcVar5 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005c8b64:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillTracer)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->tracer != NULL)
		DoKill(self->tracer, inflictor, source, damagetype, flags, filter, species);
	return 0;
}